

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

EqualsAssertionArgClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EqualsAssertionArgClauseSyntax,slang::parsing::Token&,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,Token *args,PropertyExprSyntax *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  EqualsAssertionArgClauseSyntax *pEVar6;
  
  pEVar6 = (EqualsAssertionArgClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8)
  ;
  if ((EqualsAssertionArgClauseSyntax *)this->endPtr < pEVar6 + 1) {
    pEVar6 = (EqualsAssertionArgClauseSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pEVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pEVar6->super_SyntaxNode).kind = EqualsAssertionArgClause;
  (pEVar6->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pEVar6->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pEVar6->equals).kind = TVar2;
  (pEVar6->equals).field_0x2 = uVar3;
  (pEVar6->equals).numFlags = (NumericTokenFlags)NVar4.raw;
  (pEVar6->equals).rawLen = uVar5;
  (pEVar6->equals).info = pIVar1;
  (pEVar6->expr).ptr = args_1;
  (args_1->super_SyntaxNode).parent = &pEVar6->super_SyntaxNode;
  return pEVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }